

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopFusion::ContainsBarriersOrFunctionCalls(LoopFusion *this,Loop *loop)

{
  Op OVar1;
  _Hash_node_base *p_Var2;
  Function *pFVar3;
  BasicBlock *pBVar4;
  Instruction *inst;
  Instruction *pIVar5;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar6;
  
  p_Var2 = (loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var2 == (_Hash_node_base *)0x0) {
      return false;
    }
    pFVar3 = this->containing_function_;
    UVar6 = std::
            __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                      (&pFVar3->blocks_,
                       (pFVar3->blocks_).
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&pFVar3->blocks_,
                       (pFVar3->blocks_).
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,*(undefined4 *)&p_Var2[1]._M_nxt);
    pBVar4 = ((UVar6.iterator_._M_current._M_current)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    for (pIVar5 = *(Instruction **)
                   ((long)&(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        pIVar5 != (Instruction *)
                  ((long)&(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
        pIVar5 = (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      OVar1 = pIVar5->opcode_;
      if (((OVar1 - OpTypeNamedBarrier < 3) || (OVar1 - OpControlBarrier < 2)) ||
         (OVar1 == OpFunctionCall)) {
        return true;
      }
    }
    p_Var2 = p_Var2->_M_nxt;
  } while( true );
}

Assistant:

bool LoopFusion::ContainsBarriersOrFunctionCalls(Loop* loop) {
  for (const auto& block : loop->GetBlocks()) {
    for (const auto& inst : *containing_function_->FindBlock(block)) {
      auto opcode = inst.opcode();
      if (opcode == spv::Op::OpFunctionCall ||
          opcode == spv::Op::OpControlBarrier ||
          opcode == spv::Op::OpMemoryBarrier ||
          opcode == spv::Op::OpTypeNamedBarrier ||
          opcode == spv::Op::OpNamedBarrierInitialize ||
          opcode == spv::Op::OpMemoryNamedBarrier) {
        return true;
      }
    }
  }

  return false;
}